

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

CountExpr __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
::ReadCountExpr(NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                *this)

{
  CountArgHandler handler;
  CountExpr CVar1;
  BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)47,_(mp::expr::Kind)47>_>
  *in_RDI;
  CountArgHandler CVar2;
  CountArgHandler args;
  int num_args;
  undefined8 in_stack_ffffffffffffffb8;
  int min_args;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  *in_stack_ffffffffffffffc0;
  Impl *pIVar3;
  undefined4 uStack_1c;
  
  min_args = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  ReadNumArgs(in_stack_ffffffffffffffc0,min_args);
  CVar2 = NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::BeginCount
                    ((NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *)
                     in_stack_ffffffffffffffc0,min_args);
  pIVar3 = CVar2.impl_;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
  ::
  ReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::LogicalExprReader,mp::BasicExprFactory<std::allocator<char>>::BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)47,(mp::expr::Kind)47>>>
            (in_stack_ffffffffffffffc0,min_args,in_RDI);
  handler.impl_._4_4_ = uStack_1c;
  handler.impl_._0_4_ = CVar2.arg_index_;
  handler._8_8_ = pIVar3;
  CVar1 = NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::EndCount
                    ((NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *)
                     CVar2.impl_,handler);
  return (BasicExpr<(mp::expr::Kind)47,_(mp::expr::Kind)47>)
         CVar1.super_BasicExpr<(mp::expr::Kind)47,_(mp::expr::Kind)47>.super_ExprBase.impl_;
}

Assistant:

typename Handler::CountExpr ReadCountExpr() {
    int num_args = ReadNumArgs(1);
    typename Handler::CountArgHandler args = handler_.BeginCount(num_args);
    ReadArgs<LogicalExprReader>(num_args, args);
    return handler_.EndCount(args);
  }